

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b296a::TraverseInfo::TraverseInfo(TraverseInfo *this,TraverseInfo *param_1)

{
  TraverseInfo *param_1_local;
  TraverseInfo *this_local;
  
  (this->node).inst = (param_1->node).inst;
  this->scanned = param_1->scanned;
  std::vector<cashew::Ref,_std::allocator<cashew::Ref>_>::vector(&this->children,&param_1->children)
  ;
  return;
}

Assistant:

TraverseInfo(Ref node) : node(node) {
    assert(node.get());
    if (node->isArray()) {
      for (size_t i = 0; i < node->size(); i++) {
        maybeAdd(node[i]);
      }
    } else if (node->isAssign()) {
      auto assign = node->asAssign();
      maybeAdd(assign->target());
      maybeAdd(assign->value());
    } else if (node->isAssignName()) {
      auto assign = node->asAssignName();
      maybeAdd(assign->value());
    } else {
      // no children
    }
  }